

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

char * str_skipnextword(char *src)

{
  char *pcVar1;
  ushort *puVar2;
  ushort **ppuVar3;
  char cVar4;
  char *pcVar5;
  
  if (src == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    ppuVar3 = __ctype_b_loc();
    puVar2 = *ppuVar3;
    pcVar5 = src + -1;
    do {
      pcVar1 = pcVar5 + 1;
      pcVar5 = pcVar5 + 1;
    } while ((puVar2[*pcVar1] & 1) != 0);
    cVar4 = *pcVar5;
    while ((cVar4 != '\0' && ((puVar2[cVar4] & 1) == 0))) {
      cVar4 = pcVar5[1];
      pcVar5 = pcVar5 + 1;
    }
    pcVar5 = pcVar5 + -1;
    do {
      pcVar1 = pcVar5 + 1;
      pcVar5 = pcVar5 + 1;
    } while ((puVar2[*pcVar1] & 1) != 0);
    if (*pcVar1 == '\0') {
      pcVar5 = (char *)0x0;
    }
  }
  return pcVar5;
}

Assistant:

const char *
str_skipnextword(const char *src) {
  /* sanity check */
  if (src == NULL) {
    return NULL;
  }

  /* skip whitespace prefix */
  while (isblank(*src)) {
    src++;
  }

  /* copy next word */
  while (*src != 0 && !isblank(*src)) {
    src++;
  }

  /* skip ahead in src */
  while (isblank(*src)) {
    src++;
  }

  if (*src) {
    /* return next word */
    return src;
  }

  /* end of src */
  return NULL;
}